

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&> * __thiscall
Catch::ExprLhs<protozero::data_view_const&>::operator<=
          (BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&>
           *__return_storage_ptr__,ExprLhs<protozero::data_view_const&> *this,data_view *rhs)

{
  data_view *pdVar1;
  int iVar2;
  StringRef local_48;
  data_view local_38;
  
  local_38.m_data = (char *)**(undefined8 **)this;
  local_38.m_size = (*(undefined8 **)this)[1];
  iVar2 = protozero::data_view::compare(&local_38,*rhs);
  pdVar1 = *(data_view **)this;
  StringRef::StringRef(&local_48,"<=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = iVar2 < 1;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001a8628;
  __return_storage_ptr__->m_lhs = pdVar1;
  (__return_storage_ptr__->m_op).m_start = local_48.m_start;
  (__return_storage_ptr__->m_op).m_size = local_48.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }